

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

bool __thiscall slang::ast::IntegralType::isDeclaredReg(IntegralType *this)

{
  SymbolKind SVar1;
  Type *this_00;
  bool bVar2;
  
  SVar1 = (this->super_Type).super_Symbol.kind;
  while (SVar1 == PackedArrayType) {
    this_00 = *(Type **)&this[1].super_Type.super_Symbol;
    if (this_00->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_00);
    }
    this = (IntegralType *)this_00->canonical;
    SVar1 = (this->super_Type).super_Symbol.kind;
  }
  if ((this->super_Type).canonical == (Type *)0x0) {
    Type::resolveCanonical(&this->super_Type);
  }
  if ((((this->super_Type).canonical)->super_Symbol).kind == ScalarType) {
    bVar2 = this[1].super_Type.super_Symbol.kind == Definition;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IntegralType::isDeclaredReg() const {
    const Type* type = this;
    while (type->kind == SymbolKind::PackedArrayType)
        type = &type->as<PackedArrayType>().elementType.getCanonicalType();

    if (type->isScalar())
        return type->as<ScalarType>().scalarKind == ScalarType::Reg;

    return false;
}